

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_mod_m68k(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  uint zExp;
  ulong uVar9;
  bool bVar10;
  floatx80 fVar11;
  floatx80 fVar12;
  uint64_t local_78;
  int32_t bExp;
  ulong local_68;
  int local_60;
  undefined4 uStack_5c;
  uint64_t bSig;
  uint local_4c;
  undefined4 local_48;
  int32_t aExp;
  ulong local_40;
  float_status *local_38;
  
  bSig = b.low;
  uVar8 = a._8_8_;
  fVar11.low = a.low;
  uVar5 = uVar8 & 0xffffffff;
  zExp = a._8_4_ & 0x7fff;
  bExp = b._8_4_ & 0x7fff;
  local_78 = fVar11.low;
  aExp = zExp;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        (short)bExp != 0x7fff)) {
LAB_0066e0ed:
      float_raise_m68k('\x01',status);
      fVar11 = floatx80_default_nan_m68k(status);
      auVar1 = fVar11._0_12_;
    }
    else {
LAB_0066dfe9:
      fVar11._8_8_ = uVar8 & 0xffffffff;
      fVar11 = propagateFloatx80NaN_m68k(fVar11,b,status);
      auVar1 = fVar11._0_12_;
    }
  }
  else {
    if ((short)bExp == 0) {
      if (bSig == 0) goto LAB_0066e0ed;
      normalizeFloatx80Subnormal_m68k(bSig,&bExp,&bSig);
    }
    else if (bExp == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_0066e1ca;
      goto LAB_0066dfe9;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_0066e1ca;
      normalizeFloatx80Subnormal_m68k(fVar11.low,&aExp,&local_78);
      zExp = aExp;
    }
    uVar9 = bSig | 0x8000000000000000;
    local_40 = (ulong)(uint)bExp;
    if ((int)(zExp - bExp) < 0) goto LAB_0066e1ca;
    local_48 = (undefined4)((uVar8 & 0xffff) >> 0xf);
    if (uVar9 <= local_78) {
      local_78 = local_78 - uVar9;
    }
    iVar7 = -0x40 - bExp;
    fVar11.low = 0;
    bSig = uVar9;
    local_38 = status;
    for (; uVar5 = local_40, uVar2 = local_78, 0 < (int)(zExp + iVar7); zExp = zExp - 0x3e) {
      uVar3 = estimateDiv128To64(local_78,fVar11.low,uVar9);
      uVar4 = 0;
      if (1 < uVar3) {
        uVar4 = uVar3 - 2;
      }
      mul64To128(uVar9,uVar4,(uint64_t *)&local_60,&local_68);
      local_78 = (ulong)(((int)uVar2 - local_60) - (uint)(fVar11.low < local_68)) << 0x3e |
                 fVar11.low + -local_68 >> 2;
      fVar11.low = -local_68 << 0x3e;
    }
    iVar7 = (zExp - (int)local_40) + -0x40;
    if (-0x40 < iVar7) {
      local_4c = (int)local_40 + 0x40;
      uVar4 = estimateDiv128To64(local_78,fVar11.low,uVar9);
      uVar8 = uVar4 - 2;
      if (uVar4 < 2) {
        uVar8 = 0;
      }
      bVar6 = (char)uVar5 - (char)zExp;
      mul64To128(uVar9,(uVar8 >> (bVar6 & 0x3f)) << (bVar6 & 0x3f),(uint64_t *)&local_60,&local_68);
      bVar10 = fVar11.low < local_68;
      fVar11.low = fVar11.low - local_68;
      local_78 = (uVar2 - CONCAT44(uStack_5c,local_60)) - (ulong)bVar10;
      uVar5 = uVar9 << (bVar6 & 0x3f);
      uVar9 = uVar9 >> ((byte)iVar7 & 0x3f);
      if (local_4c == zExp) {
        uVar9 = 0;
      }
      while( true ) {
        if ((local_78 <= uVar9) && (fVar11.low < uVar5 || local_78 != uVar9)) break;
        bVar10 = fVar11.low < uVar5;
        fVar11.low = fVar11.low - uVar5;
        local_78 = (local_78 - uVar9) - (ulong)bVar10;
      }
    }
    fVar11 = normalizeRoundAndPackFloatx80_m68k
                       ('P',(flag)local_48,zExp,local_78,fVar11.low,local_38);
    auVar1 = fVar11._0_12_;
  }
  fVar11.low = auVar1._0_8_;
  uVar5 = (ulong)auVar1._8_4_;
LAB_0066e1ca:
  fVar12._8_8_ = uVar5;
  fVar12.low = fVar11.low;
  return fVar12;
}

Assistant:

floatx80 floatx80_mod(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t qTemp, term0, term1;

    aSig0 = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);
    bSig = extractFloatx80Frac(b);
    bExp = extractFloatx80Exp(b);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig0 << 1)
            || ((bExp == 0x7FFF) && (uint64_t) (bSig << 1))) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if (bExp == 0x7FFF) {
        if ((uint64_t) (bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if (bExp == 0) {
        if (bSig == 0) {
        invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal(bSig, &bExp, &bSig);
    }
    if (aExp == 0) {
        if ((uint64_t) (aSig0 << 1) == 0) {
            return a;
        }
        normalizeFloatx80Subnormal(aSig0, &aExp, &aSig0);
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if (expDiff < 0) {
        return a;
    }
    qTemp = (bSig <= aSig0);
    if (qTemp) {
        aSig0 -= bSig;
    }
    expDiff -= 64;
    while (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        mul64To128(bSig, qTemp, &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(aSig0, aSig1, 62, &aSig0, &aSig1);
        expDiff -= 62;
    }
    expDiff += 64;
    if (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        qTemp >>= 64 - expDiff;
        mul64To128(bSig, qTemp << (64 - expDiff), &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(0, bSig, 64 - expDiff, &term0, &term1);
        while (le128(term0, term1, aSig0, aSig1)) {
            ++qTemp;
            sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        }
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);
}